

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall
soplex::SLUFactor<double>::solveRight
          (SLUFactor<double> *this,SSVectorBase<double> *x,SVectorBase<double> *b)

{
  double *vec;
  CLUFactor<double> *in_RDI;
  SSVectorBase<double> *in_stack_ffffffffffffffd0;
  pointer *this_00;
  SVectorBase<double> *in_stack_ffffffffffffffd8;
  
  (**(code **)(*(long *)in_RDI[1].u.row.idx + 0x18))();
  VectorBase<double>::assign<double>((VectorBase<double> *)in_RDI,in_stack_ffffffffffffffd8);
  SSVectorBase<double>::clear(in_stack_ffffffffffffffd0);
  this_00 = (pointer *)&in_RDI->initMaxabs;
  vec = SSVectorBase<double>::altValues((SSVectorBase<double> *)this_00);
  VectorBase<double>::get_ptr((VectorBase<double> *)0x2502d8);
  CLUFactor<double>::solveRight(in_RDI,vec,(double *)this_00);
  *(int *)((long)&in_RDI[1].u.row.start + 4) = *(int *)((long)&in_RDI[1].u.row.start + 4) + 1;
  (**(code **)(*(long *)in_RDI[1].u.row.idx + 0x20))();
  return;
}

Assistant:

void SLUFactor<R>::solveRight(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{

   solveTime->start();

   vec.assign(b);
   x.clear();
   CLUFactor<R>::solveRight(x.altValues(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}